

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Block * __thiscall soul::StructuralParser::parseStatementAsNewBlock(StructuralParser *this)

{
  char *pcVar1;
  Scope *pSVar2;
  Block *pBVar3;
  Context local_40;
  void *local_28;
  pool_ptr<soul::AST::Function> local_20;
  
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar1 == "{") || (((pcVar1 != (char *)0x0 && (*pcVar1 == '{')) && (pcVar1[1] == '\0')))) {
    local_20.object = (Function *)0x0;
    pBVar3 = parseBracedBlock(this,&local_20);
  }
  else {
    local_40.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
    if (local_40.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_40.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_40.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_40.location.location.data = (this->super_SOULTokeniser).location.location.data;
    local_40.parentScope = this->currentScope;
    local_28 = (void *)0x0;
    pBVar3 = PoolAllocator::allocate<soul::AST::Block,soul::AST::Context,decltype(nullptr)>
                       (&this->allocator->pool,&local_40,&local_28);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_40.location.sourceCode.object);
    pSVar2 = this->currentScope;
    this->currentScope = &pBVar3->super_Scope;
    local_40.location.sourceCode.object = (SourceCodeText *)parseStatement(this);
    std::
    vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
    ::emplace_back<soul::pool_ref<soul::AST::Statement>>
              ((vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
                *)&pBVar3->statements,(pool_ref<soul::AST::Statement> *)&local_40);
    this->currentScope = pSVar2;
  }
  return pBVar3;
}

Assistant:

AST::Block& parseStatementAsNewBlock()
    {
        if (matches (Operator::openBrace))
            return parseBracedBlock ({});

        auto& newBlock = allocate<AST::Block> (getContext(), nullptr);
        ScopedScope scope (*this, newBlock);
        newBlock.addStatement (parseStatement());
        return newBlock;
    }